

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall QAbstractItemView::viewportEvent(QAbstractItemView *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QAbstractItemViewPrivate *sender;
  QPoint *pQVar4;
  long *plVar5;
  StateFlag other;
  QEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QHelpEvent *he;
  QAbstractItemViewPrivate *d;
  QModelIndex index;
  QStatusTipEvent tip;
  QString empty;
  QStyleOptionViewItem option;
  QWidget *in_stack_fffffffffffffd78;
  code *other_00;
  QAbstractItemViewPrivate *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  QAbstractItemViewPrivate *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffdb0;
  QAbstractItemViewPrivate *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined8 in_stack_fffffffffffffdd0;
  ConnectionType type;
  Object *in_stack_fffffffffffffdd8;
  bool local_201;
  Connection in_stack_fffffffffffffe10;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [24];
  QStatusTipEvent local_190 [40];
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 local_150 [24];
  QPersistentModelIndex local_138;
  undefined1 local_130 [24];
  QPersistentModelIndex local_118;
  QPointF local_110;
  QPoint local_100;
  undefined1 local_f8 [24];
  QPersistentModelIndex local_e0;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [2];
  undefined1 local_c8 [16];
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sender = d_func((QAbstractItemView *)0x803ba5);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == Enter) {
    sender->viewportEnteredNeeded = true;
  }
  else if (TVar3 == Leave) {
    QModelIndex::QModelIndex((QModelIndex *)0x803d7b);
    QPersistentModelIndex::QPersistentModelIndex(&local_138,(QModelIndex *)local_150);
    QAbstractItemViewPrivate::setHoverIndex
              (in_stack_fffffffffffffdb8,
               (QPersistentModelIndex *)CONCAT44(TVar3,in_stack_fffffffffffffdb0));
    QPersistentModelIndex::~QPersistentModelIndex(&local_138);
    if (((sender->shouldClearStatusTip & 1U) != 0) &&
       (*(long *)&(sender->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                  super_QWidgetPrivate.field_0x10 != 0)) {
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x803e0b);
      memset(local_190,0xaa,0x28);
      QStatusTipEvent::QStatusTipEvent(local_190,(QString *)&local_168);
      QCoreApplication::sendEvent
                (*(QObject **)
                  &(sender->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                   super_QWidgetPrivate.field_0x10,(QEvent *)local_190);
      sender->shouldClearStatusTip = false;
      QStatusTipEvent::~QStatusTipEvent(local_190);
      QString::~QString((QString *)0x803e73);
    }
    QModelIndex::QModelIndex((QModelIndex *)0x803e80);
    QPersistentModelIndex::operator=(&sender->enteredIndex,(QModelIndex *)local_1a8);
  }
  else if (TVar3 == Paint) {
    QAbstractItemViewPrivate::executePostedLayout(in_stack_fffffffffffffd80);
  }
  else if (TVar3 - WindowActivate < 2) {
    QWidget::update(in_stack_fffffffffffffd78);
  }
  else if (TVar3 == FontChange) {
    QAbstractItemViewPrivate::doDelayedItemsLayout
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  }
  else {
    if ((TVar3 - ToolTip < 2) || (TVar3 == QueryWhatsThis)) {
      local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QHelpEvent::pos((QHelpEvent *)in_RSI);
      (**(code **)(*in_RDI + 0x1f0))(&local_1c0,in_RDI,pQVar4);
      memset(local_d8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x803f1c);
      (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
      local_c8 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,&local_1c0);
      currentIndex((QAbstractItemView *)in_stack_fffffffffffffd90);
      bVar1 = ::operator==((QModelIndex *)in_stack_fffffffffffffd80,
                           (QModelIndex *)in_stack_fffffffffffffd78);
      other = State_None;
      if (bVar1) {
        other = State_HasFocus;
      }
      QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,other);
      plVar5 = (long *)(**(code **)(*in_RDI + 0x208))(in_RDI,&local_1c0);
      if (plVar5 == (long *)0x0) {
        local_201 = false;
      }
      else {
        bVar2 = (**(code **)(*plVar5 + 0xa0))(plVar5,in_RSI,in_RDI,local_d8,&local_1c0);
        local_201 = (bool)(bVar2 & 1);
      }
      QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_stack_fffffffffffffd80)
      ;
      goto LAB_00804130;
    }
    if (TVar3 == HoverEnter) {
LAB_00803c71:
      local_110 = QSinglePointEvent::position((QSinglePointEvent *)0x803c85);
      local_100 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffd90);
      (**(code **)(*in_RDI + 0x1f0))(local_f8,in_RDI,&local_100);
      QPersistentModelIndex::QPersistentModelIndex(&local_e0,(QModelIndex *)local_f8);
      QAbstractItemViewPrivate::setHoverIndex
                (in_stack_fffffffffffffdb8,
                 (QPersistentModelIndex *)CONCAT44(TVar3,in_stack_fffffffffffffdb0));
      QPersistentModelIndex::~QPersistentModelIndex(&local_e0);
    }
    else if (TVar3 == HoverLeave) {
      QModelIndex::QModelIndex((QModelIndex *)0x803d1a);
      QPersistentModelIndex::QPersistentModelIndex(&local_118,(QModelIndex *)local_130);
      QAbstractItemViewPrivate::setHoverIndex
                (in_stack_fffffffffffffdb8,
                 (QPersistentModelIndex *)CONCAT44(TVar3,in_stack_fffffffffffffdb0));
      QPersistentModelIndex::~QPersistentModelIndex(&local_118);
    }
    else {
      if (TVar3 == HoverMove) goto LAB_00803c71;
      if (TVar3 == ScrollPrepare) {
        executeDelayedItemsLayout((QAbstractItemView *)in_stack_fffffffffffffd80);
        QScroller::scroller((QObject *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
        other_00 = QAbstractItemViewPrivate::scrollerStateChanged;
        in_stack_fffffffffffffd80 = (QAbstractItemViewPrivate *)0x0;
        QObjectPrivate::
        connect<void(QScroller::*)(QScroller::State),void(QAbstractItemViewPrivate::*)()>
                  ((Object *)sender,(offset_in_QScroller_to_subr)in_stack_fffffffffffffe10.d_ptr,
                   in_stack_fffffffffffffdd8,0x7ff7f0,type);
        QMetaObject::Connection::operator=
                  ((Connection *)in_stack_fffffffffffffd80,(Connection *)other_00);
        QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffe10);
      }
    }
  }
  local_201 = QAbstractScrollArea::viewportEvent
                        ((QAbstractScrollArea *)
                         CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                         (QEvent *)in_stack_fffffffffffffd80);
LAB_00804130:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_201;
}

Assistant:

bool QAbstractItemView::viewportEvent(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        // Similar to pre-painting in QAbstractItemView::event to update scrollbar
        // visibility, make sure that all pending layout requests have been executed
        // so that the view's data structures are up-to-date before rendering.
        d->executePostedLayout();
        break;
    case QEvent::HoverMove:
    case QEvent::HoverEnter:
        d->setHoverIndex(indexAt(static_cast<QHoverEvent*>(event)->position().toPoint()));
        break;
    case QEvent::HoverLeave:
        d->setHoverIndex(QModelIndex());
        break;
    case QEvent::Enter:
        d->viewportEnteredNeeded = true;
        break;
    case QEvent::Leave:
        d->setHoverIndex(QModelIndex()); // If we've left, no hover should be needed anymore
    #if QT_CONFIG(statustip)
        if (d->shouldClearStatusTip && d->parent) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(d->parent, &tip);
            d->shouldClearStatusTip = false;
        }
    #endif
        d->enteredIndex = QModelIndex();
        break;
    case QEvent::ToolTip:
    case QEvent::QueryWhatsThis:
    case QEvent::WhatsThis: {
        QHelpEvent *he = static_cast<QHelpEvent*>(event);
        const QModelIndex index = indexAt(he->pos());
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        option.rect = visualRect(index);
        option.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

        QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
        if (!delegate)
            return false;
        return delegate->helpEvent(he, this, option, index);
    }
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->viewport->update();
        break;
    case QEvent::ScrollPrepare:
        executeDelayedItemsLayout();
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
        d->scollerConnection = QObjectPrivate::connect(
              QScroller::scroller(d->viewport), &QScroller::stateChanged,
              d, &QAbstractItemViewPrivate::scrollerStateChanged,
              Qt::UniqueConnection);
#endif
        break;

    default:
        break;
    }
    return QAbstractScrollArea::viewportEvent(event);
}